

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlUTF8Strsize(xmlChar *utf,int len)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  xmlChar *ptr;
  
  iVar1 = 0;
  pbVar2 = utf;
  if (0 < len && utf != (xmlChar *)0x0) {
    while ((0 < len && (bVar3 = *pbVar2, bVar3 != 0))) {
      len = len + -1;
      pbVar2 = pbVar2 + 1;
      if ((char)bVar3 < '\0') {
        for (; ((bVar3 & 0x40) != 0 && (*pbVar2 != 0)); pbVar2 = pbVar2 + 1) {
          bVar3 = bVar3 * '\x02';
        }
      }
    }
    iVar1 = (int)((long)pbVar2 - (long)utf);
    if (0x7fffffff < (ulong)((long)pbVar2 - (long)utf)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlUTF8Strsize(const xmlChar *utf, int len) {
    const xmlChar *ptr=utf;
    int ch;
    size_t ret;

    if (utf == NULL)
        return(0);

    if (len <= 0)
        return(0);

    while ( len-- > 0) {
        if ( !*ptr )
            break;
        if ( (ch = *ptr++) & 0x80)
            while ((ch<<=1) & 0x80 ) {
		if (*ptr == 0) break;
                ptr++;
	    }
    }
    ret = ptr - utf;
    return (ret > INT_MAX ? 0 : ret);
}